

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

Sample * __thiscall
deqp::gles3::Performance::anon_unknown_0::ReversedDepthOrderCullCase::renderSample
          (Sample *__return_storage_ptr__,ReversedDepthOrderCullCase *this,RenderData *occluder,
          RenderData *occluded,int workload)

{
  deUint32 dVar1;
  code *pcVar2;
  Sample *pSVar3;
  ReversedDepthOrderCullCase *pRVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  deUint64 dVar8;
  deUint64 dVar9;
  long lVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  deUint8 buffer [4];
  undefined1 local_4c [4];
  Sample *local_48;
  deUint64 local_40;
  ReversedDepthOrderCullCase *local_38;
  long lVar7;
  undefined4 extraout_var_00;
  
  local_48 = __return_storage_ptr__;
  local_38 = this;
  iVar5 = (*((this->super_RelativeChangeCase).super_BaseCase.m_renderCtx)->_vptr_RenderContext[3])()
  ;
  lVar7 = CONCAT44(extraout_var,iVar5);
  dVar1 = (occluded->m_program).m_program.m_program;
  (**(code **)(lVar7 + 0x1680))(dVar1);
  pcVar2 = *(code **)(lVar7 + 0x14f0);
  uVar6 = (**(code **)(lVar7 + 0xb48))(dVar1,"u_iterations");
  (*pcVar2)(uVar6,workload);
  (**(code **)(lVar7 + 0x188))(0x4500);
  (**(code **)(lVar7 + 0x4e8))(0xb71);
  (**(code **)(lVar7 + 0x1220))(0,0,1,1,0x1908,0x1401,local_4c);
  dVar8 = deGetMicroseconds();
  (**(code **)(lVar7 + 0x188))(0x4500);
  (**(code **)(lVar7 + 0x4e8))(0xb71);
  (**(code **)(lVar7 + 0x1220))(0,0,1,1,0x1908,0x1401,local_4c);
  dVar9 = deGetMicroseconds();
  pSVar3 = local_48;
  local_48->nullTime = dVar9 - dVar8;
  local_40 = deGetMicroseconds();
  (**(code **)(lVar7 + 0x188))(0x4500);
  (**(code **)(lVar7 + 0x5e0))(0xb71);
  pRVar4 = local_38;
  iVar5 = (*((local_38->super_RelativeChangeCase).super_BaseCase.m_renderCtx)->_vptr_RenderContext
            [3])();
  lVar10 = CONCAT44(extraout_var_00,iVar5);
  (**(code **)(lVar10 + 0x1680))((occluded->m_program).m_program.m_program);
  (**(code **)(lVar10 + 0xd8))((occluded->m_vao).super_ObjectWrapper.m_object);
  (**(code **)(lVar10 + 0x538))(4,0,occluded->m_numVertices);
  (**(code **)(lVar10 + 0xd8))(0);
  iVar5 = (*((pRVar4->super_RelativeChangeCase).super_BaseCase.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  lVar10 = CONCAT44(extraout_var_01,iVar5);
  (**(code **)(lVar10 + 0x1680))((occluder->m_program).m_program.m_program);
  (**(code **)(lVar10 + 0xd8))((occluder->m_vao).super_ObjectWrapper.m_object);
  (**(code **)(lVar10 + 0x538))(4,0,occluder->m_numVertices);
  (**(code **)(lVar10 + 0xd8))(0);
  (**(code **)(lVar7 + 0x1220))(0,0,1,1,0x1908,0x1401,local_4c);
  dVar8 = deGetMicroseconds();
  pSVar3->testTime = dVar8 - local_40;
  dVar8 = deGetMicroseconds();
  (**(code **)(lVar7 + 0x188))(0x4500);
  (**(code **)(lVar7 + 0x4e8))(0xb71);
  iVar5 = (*((pRVar4->super_RelativeChangeCase).super_BaseCase.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  lVar10 = CONCAT44(extraout_var_02,iVar5);
  (**(code **)(lVar10 + 0x1680))((occluded->m_program).m_program.m_program);
  (**(code **)(lVar10 + 0xd8))((occluded->m_vao).super_ObjectWrapper.m_object);
  (**(code **)(lVar10 + 0x538))(4,0,occluded->m_numVertices);
  (**(code **)(lVar10 + 0xd8))(0);
  iVar5 = (*((pRVar4->super_RelativeChangeCase).super_BaseCase.m_renderCtx)->_vptr_RenderContext[3])
                    ();
  lVar10 = CONCAT44(extraout_var_03,iVar5);
  (**(code **)(lVar10 + 0x1680))((occluder->m_program).m_program.m_program);
  (**(code **)(lVar10 + 0xd8))((occluder->m_vao).super_ObjectWrapper.m_object);
  (**(code **)(lVar10 + 0x538))(4,0,occluder->m_numVertices);
  (**(code **)(lVar10 + 0xd8))(0);
  (**(code **)(lVar7 + 0x1220))(0,0,1,1,0x1908,0x1401,local_4c);
  dVar9 = deGetMicroseconds();
  local_48->baseTime = dVar9 - dVar8;
  local_48->workload = 0;
  return local_48;
}

Assistant:

Sample				renderSample				(const RenderData& occluder, const RenderData& occluded, int workload) const
	{
		const glw::Functions&	gl		= m_renderCtx.getFunctions();
		const GLuint			program	= occluded.m_program.getProgram();
		Sample					sample;
		deUint64				now		= 0;
		deUint64				prev	= 0;
		deUint8					buffer[4];

		gl.useProgram(program);
		gl.uniform1i(gl.getUniformLocation(program, "u_iterations"), workload);

		// Warmup (this workload seems to reduce variation in following workloads)
		{
			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
			gl.disable(GL_DEPTH_TEST);

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
		}

		// Null time
		{
			prev = deGetMicroseconds();

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
			gl.disable(GL_DEPTH_TEST);

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

			now = deGetMicroseconds();

			sample.nullTime = now - prev;
		}

		// Test time
		{
			prev = deGetMicroseconds();

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
			gl.enable(GL_DEPTH_TEST);

			render(occluded);
			render(occluder);

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

			now = deGetMicroseconds();

			sample.testTime = now - prev;
		}

		// Base time
		{
			prev = deGetMicroseconds();

			gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
			gl.disable(GL_DEPTH_TEST);

			render(occluded);
			render(occluder);

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

			now = deGetMicroseconds();

			sample.baseTime = now - prev;
		}

		sample.workload = 0;

		return sample;
	}